

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execution_demand.hpp
# Opt level: O0

void __thiscall so_5::execution_demand_t::execution_demand_t(execution_demand_t *this)

{
  execution_demand_t *this_local;
  
  this->m_receiver = (agent_t *)0x0;
  this->m_limit = (control_block_t *)0x0;
  this->m_mbox_id = 0;
  std::type_index::type_index(&this->m_msg_type,(type_info *)&void::typeinfo);
  intrusive_ptr_t<so_5::message_t>::intrusive_ptr_t(&this->m_message_ref);
  this->m_demand_handler = (demand_handler_pfn_t)0x0;
  return;
}

Assistant:

execution_demand_t()
		:	m_receiver( nullptr )
		,	m_limit( nullptr )
		,	m_mbox_id( 0 )
		,	m_msg_type( typeid(void) )
		,	m_demand_handler( nullptr )
		{}